

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuMatrix.hpp
# Opt level: O1

void __thiscall
tcu::Matrix<tcu::Interval,_4,_2>::Matrix
          (Matrix<tcu::Interval,_4,_2> *this,Matrix<tcu::Interval,_4,_2> *src)

{
  bool *pbVar1;
  bool *pbVar2;
  double dVar3;
  int row;
  long lVar4;
  Vector<tcu::Interval,_4> *pVVar5;
  undefined8 *puVar6;
  long lVar7;
  bool bVar8;
  undefined1 auStack_70 [8];
  undefined8 auStack_68 [13];
  
  lVar4 = 0;
  pVVar5 = (Vector<tcu::Interval,_4> *)this;
  do {
    lVar7 = 0x10;
    do {
      *(undefined1 *)
       ((long)((Vector<tcu::Vector<tcu::Interval,_4>,_2> *)pVVar5->m_data)->m_data[0].m_data +
       lVar7 + -0x10) = 0;
      *(undefined8 *)
       ((long)((Vector<tcu::Vector<tcu::Interval,_4>,_2> *)pVVar5->m_data)->m_data[0].m_data +
       lVar7 + -8) = 0x7ff0000000000000;
      *(undefined8 *)
       (&((Vector<tcu::Vector<tcu::Interval,_4>,_2> *)pVVar5->m_data)->m_data[0].m_data[0].m_hasNaN
       + lVar7) = 0xfff0000000000000;
      lVar7 = lVar7 + 0x18;
    } while (lVar7 != 0x70);
    lVar7 = 0x10;
    do {
      *(undefined1 *)
       ((long)((Vector<tcu::Vector<tcu::Interval,_4>,_2> *)pVVar5->m_data)->m_data[0].m_data +
       lVar7 + -0x10) = 0;
      *(undefined8 *)
       ((long)((Vector<tcu::Vector<tcu::Interval,_4>,_2> *)pVVar5->m_data)->m_data[0].m_data +
       lVar7 + -8) = 0x7ff0000000000000;
      *(undefined8 *)
       (&((Vector<tcu::Vector<tcu::Interval,_4>,_2> *)pVVar5->m_data)->m_data[0].m_data[0].m_hasNaN
       + lVar7) = 0xfff0000000000000;
      lVar7 = lVar7 + 0x18;
    } while (lVar7 != 0x70);
    lVar4 = lVar4 + 0x60;
    pVVar5 = pVVar5 + 1;
  } while (lVar4 != 0xc0);
  lVar4 = 0;
  do {
    lVar7 = 0x10;
    do {
      auStack_70[lVar7] = 0;
      *(undefined8 *)((long)auStack_68 + lVar7) = 0x7ff0000000000000;
      *(undefined8 *)((long)auStack_68 + lVar7 + 8) = 0xfff0000000000000;
      lVar7 = lVar7 + 0x18;
    } while (lVar7 != 0x70);
    lVar7 = 0x10;
    do {
      auStack_70[lVar7] = 0;
      *(undefined8 *)((long)auStack_68 + lVar7) = 0x7ff0000000000000;
      *(undefined8 *)((long)auStack_68 + lVar7 + 8) = 0xfff0000000000000;
      lVar7 = lVar7 + 0x18;
    } while (lVar7 != 0x70);
    pVVar5 = (this->m_data).m_data + lVar4;
    puVar6 = auStack_68;
    for (lVar7 = 0xc; puVar6 = puVar6 + 1, lVar7 != 0; lVar7 = lVar7 + -1) {
      *(undefined8 *)pVVar5->m_data = *puVar6;
      pVVar5 = (Vector<tcu::Interval,_4> *)&pVVar5->m_data[0].m_lo;
    }
    bVar8 = lVar4 == 0;
    lVar4 = lVar4 + 1;
  } while (bVar8);
  lVar4 = 0;
  do {
    lVar7 = 0;
    do {
      *(undefined8 *)((long)&((Interval *)this)->m_hi + lVar7) =
           *(undefined8 *)((long)&((Interval *)src)->m_hi + lVar7);
      pbVar1 = &((Vector<tcu::Vector<tcu::Interval,_4>,_2> *)&((Interval *)src)->m_hasNaN)->m_data
                [0].m_data[0].m_hasNaN + lVar7;
      dVar3 = *(double *)(pbVar1 + 8);
      pbVar2 = &((Vector<tcu::Vector<tcu::Interval,_4>,_2> *)&((Interval *)this)->m_hasNaN)->m_data
                [0].m_data[0].m_hasNaN + lVar7;
      *(undefined8 *)pbVar2 = *(undefined8 *)pbVar1;
      *(double *)(pbVar2 + 8) = dVar3;
      lVar7 = lVar7 + 0x60;
    } while (lVar7 == 0x60);
    lVar4 = lVar4 + 1;
    this = (Matrix<tcu::Interval,_4,_2> *)((long)this + 0x18);
    src = (Matrix<tcu::Interval,_4,_2> *)((long)src + 0x18);
  } while (lVar4 != 4);
  return;
}

Assistant:

Matrix<T, Rows, Cols>::Matrix (const Matrix<T, Rows, Cols>& src)
{
	*this = src;
}